

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_tools_enc.c
# Opt level: O1

void WebPBlendAlpha(WebPPicture *picture,uint32_t background_rgb)

{
  byte bVar1;
  uint uVar2;
  uint8_t *puVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint8_t *puVar8;
  uint uVar9;
  uint32_t *puVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  uint8_t *puVar14;
  uint uVar15;
  uint8_t *puVar16;
  uint8_t *__s;
  uint uVar17;
  
  if (picture != (WebPPicture *)0x0) {
    uVar4 = background_rgb >> 0x10 & 0xff;
    uVar5 = background_rgb >> 8 & 0xff;
    uVar2 = background_rgb & 0xff;
    if (picture->use_argb == 0) {
      __s = picture->a;
      if (((__s != (uint8_t *)0x0 & (byte)(char)picture->colorspace >> 2) == 1) &&
         (0 < picture->height)) {
        uVar17 = picture->width >> 1;
        uVar15 = uVar5 * -0x12a24 + 0x2020000 + uVar2 * 0x1c200 + uVar4 * -0x97dc >> 0x12;
        uVar12 = uVar5 * -0x178d0 + 0x2020000 + uVar2 * -0x4930 + uVar4 * 0x1c200 >> 0x12;
        puVar8 = picture->y;
        puVar14 = picture->u;
        puVar16 = picture->v;
        uVar9 = 0;
        do {
          if (0 < picture->width) {
            lVar13 = 0;
            do {
              bVar1 = __s[lVar13];
              if (bVar1 != 0xff) {
                puVar8[lVar13] =
                     (uint8_t)(((uint)puVar8[lVar13] * (uint)bVar1 +
                               (bVar1 ^ 0xff) *
                               (uVar5 * 0x8123 + uVar2 * 0x1914 + uVar4 * 0x41c7 + 0x108000 >> 0x10)
                               ) * 0x101 + 0x100 >> 0x10);
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 < picture->width);
          }
          if ((uVar9 & 1) == 0) {
            puVar3 = __s;
            if ((uVar9 | 1) != picture->height) {
              puVar3 = __s + picture->a_stride;
            }
            if ((int)uVar17 < 1) {
              uVar6 = 0;
            }
            else {
              uVar6 = 0;
              do {
                iVar11 = (uint)puVar3[uVar6 * 2 + 1] + (uint)puVar3[uVar6 * 2] +
                         (uint)__s[uVar6 * 2 + 1] + (uint)__s[uVar6 * 2];
                puVar14[uVar6] =
                     (uint8_t)(((uint)puVar14[uVar6] * iVar11 + (0x3fc - iVar11) * uVar15) * 0x101 +
                               0x400 >> 0x12);
                puVar16[uVar6] =
                     (uint8_t)(((uint)puVar16[uVar6] * iVar11 + (0x3fc - iVar11) * uVar12) * 0x101 +
                               0x400 >> 0x12);
                uVar6 = uVar6 + 1;
              } while (uVar17 != uVar6);
            }
            if ((picture->width & 1) != 0) {
              uVar6 = uVar6 & 0xffffffff;
              iVar11 = ((uint)puVar3[uVar6 * 2] + (uint)__s[uVar6 * 2]) * 2;
              iVar7 = ((uint)puVar3[uVar6 * 2] + (uint)__s[uVar6 * 2]) * -2 + 0x3fc;
              puVar14[uVar6] =
                   (uint8_t)(((uint)puVar14[uVar6] * iVar11 + iVar7 * uVar15) * 0x101 + 0x400 >>
                            0x12);
              puVar16[uVar6] =
                   (uint8_t)(((uint)puVar16[uVar6] * iVar11 + iVar7 * uVar12) * 0x101 + 0x400 >>
                            0x12);
            }
          }
          else {
            puVar14 = puVar14 + picture->uv_stride;
            puVar16 = puVar16 + picture->uv_stride;
          }
          memset(__s,0xff,(long)picture->width);
          __s = __s + picture->a_stride;
          puVar8 = puVar8 + picture->y_stride;
          uVar9 = uVar9 + 1;
        } while ((int)uVar9 < picture->height);
      }
    }
    else if (0 < picture->height) {
      puVar10 = picture->argb;
      iVar11 = 0;
      do {
        if (0 < picture->width) {
          lVar13 = 0;
          do {
            uVar9 = puVar10[lVar13];
            uVar17 = uVar9 >> 0x18;
            if (uVar17 != 0xff) {
              uVar15 = uVar5 << 8 | uVar4 << 0x10 | uVar2;
              if (0xffffff < uVar9) {
                uVar15 = uVar17 ^ 0xff;
                uVar15 = ((uVar9 >> 8 & 0xff) * uVar17 + uVar15 * uVar5) * 0x101 + 0x100 >> 8 &
                         0xffff00 |
                         ((uVar9 & 0xff) * uVar17 + uVar15 * uVar2) * 0x101 + 0x100 >> 0x10 |
                         ((uVar9 >> 0x10 & 0xff) * uVar17 + uVar15 * uVar4) * 0x101 + 0x100 &
                         0xff0000;
              }
              puVar10[lVar13] = uVar15 | 0xff000000;
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 < picture->width);
        }
        puVar10 = puVar10 + picture->argb_stride;
        iVar11 = iVar11 + 1;
      } while (iVar11 < picture->height);
    }
  }
  return;
}

Assistant:

void WebPBlendAlpha(WebPPicture* picture, uint32_t background_rgb) {
  const int red = (background_rgb >> 16) & 0xff;
  const int green = (background_rgb >> 8) & 0xff;
  const int blue = (background_rgb >> 0) & 0xff;
  int x, y;
  if (picture == NULL) return;
  if (!picture->use_argb) {
    // omit last pixel during u/v loop
    const int uv_width = (picture->width >> 1);
    const int Y0 = VP8RGBToY(red, green, blue, YUV_HALF);
    // VP8RGBToU/V expects the u/v values summed over four pixels
    const int U0 = VP8RGBToU(4 * red, 4 * green, 4 * blue, 4 * YUV_HALF);
    const int V0 = VP8RGBToV(4 * red, 4 * green, 4 * blue, 4 * YUV_HALF);
    const int has_alpha = picture->colorspace & WEBP_CSP_ALPHA_BIT;
    uint8_t* y_ptr = picture->y;
    uint8_t* u_ptr = picture->u;
    uint8_t* v_ptr = picture->v;
    uint8_t* a_ptr = picture->a;
    if (!has_alpha || a_ptr == NULL) return;    // nothing to do
    for (y = 0; y < picture->height; ++y) {
      // Luma blending
      for (x = 0; x < picture->width; ++x) {
        const uint8_t alpha = a_ptr[x];
        if (alpha < 0xff) {
          y_ptr[x] = BLEND(Y0, y_ptr[x], alpha);
        }
      }
      // Chroma blending every even line
      if ((y & 1) == 0) {
        uint8_t* const a_ptr2 =
            (y + 1 == picture->height) ? a_ptr : a_ptr + picture->a_stride;
        for (x = 0; x < uv_width; ++x) {
          // Average four alpha values into a single blending weight.
          // TODO(skal): might lead to visible contouring. Can we do better?
          const uint32_t alpha =
              a_ptr[2 * x + 0] + a_ptr[2 * x + 1] +
              a_ptr2[2 * x + 0] + a_ptr2[2 * x + 1];
          u_ptr[x] = BLEND_10BIT(U0, u_ptr[x], alpha);
          v_ptr[x] = BLEND_10BIT(V0, v_ptr[x], alpha);
        }
        if (picture->width & 1) {  // rightmost pixel
          const uint32_t alpha = 2 * (a_ptr[2 * x + 0] + a_ptr2[2 * x + 0]);
          u_ptr[x] = BLEND_10BIT(U0, u_ptr[x], alpha);
          v_ptr[x] = BLEND_10BIT(V0, v_ptr[x], alpha);
        }
      } else {
        u_ptr += picture->uv_stride;
        v_ptr += picture->uv_stride;
      }
      memset(a_ptr, 0xff, picture->width);  // reset alpha value to opaque
      a_ptr += picture->a_stride;
      y_ptr += picture->y_stride;
    }
  } else {
    uint32_t* argb = picture->argb;
    const uint32_t background = MakeARGB32(red, green, blue);
    for (y = 0; y < picture->height; ++y) {
      for (x = 0; x < picture->width; ++x) {
        const int alpha = (argb[x] >> 24) & 0xff;
        if (alpha != 0xff) {
          if (alpha > 0) {
            int r = (argb[x] >> 16) & 0xff;
            int g = (argb[x] >>  8) & 0xff;
            int b = (argb[x] >>  0) & 0xff;
            r = BLEND(red, r, alpha);
            g = BLEND(green, g, alpha);
            b = BLEND(blue, b, alpha);
            argb[x] = MakeARGB32(r, g, b);
          } else {
            argb[x] = background;
          }
        }
      }
      argb += picture->argb_stride;
    }
  }
}